

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::ScalabilityTest_TestNoMismatch2SpatialLayers_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::ScalabilityTest_TestNoMismatch2SpatialLayers_Test>
           *this)

{
  ScalabilityTest *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode>>::parameter_
       = &this->parameter_;
  this_00 = (ScalabilityTest *)operator_new(0x3f8);
  anon_unknown.dwarf_1a9fc79::ScalabilityTest::ScalabilityTest(this_00);
  (this_00->super_CodecTestWithParam<libaom_test::TestMode>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  super_Test._vptr_Test = (_func_int **)&PTR__ScalabilityTest_0108d4d8;
  (this_00->super_CodecTestWithParam<libaom_test::TestMode>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  _vptr_WithParamInterface =
       (_func_int **)&PTR__ScalabilityTest_TestNoMismatch2SpatialLayers_Test_0108d520;
  (this_00->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__ScalabilityTest_TestNoMismatch2SpatialLayers_Test_0108d540;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }